

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picklpf.c
# Opt level: O0

int64_t try_filter_frame(YV12_BUFFER_CONFIG *sd,AV1_COMP *cpi,int filt_level,int partial_frame,
                        int plane,int dir)

{
  AV1_COMMON *cm_00;
  long lVar1;
  int64_t iVar2;
  undefined4 in_EDX;
  int unaff_EBX;
  long in_RSI;
  AVxWorker *in_RDI;
  int in_R8D;
  int in_R9D;
  AV1LfSync *unaff_retaddr;
  int in_stack_00000008;
  int lpf_opt_level;
  int filter_level [2];
  int64_t filt_err;
  AV1_COMMON *cm;
  int num_workers;
  MultiThreadInfo *mt_info;
  YV12_BUFFER_CONFIG *dst_bc;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff94;
  YV12_BUFFER_CONFIG *a;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 in_stack_ffffffffffffffb8;
  int partial_frame_00;
  undefined4 in_stack_ffffffffffffffc8;
  
  partial_frame_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  cm_00 = (AV1_COMMON *)(in_RSI + 0x9ae48);
  uVar3 = *(undefined4 *)(in_RSI + 0x9ae60);
  lVar1 = in_RSI + 0x3bf80;
  local_4c = in_EDX;
  if ((in_R8D == 0) && (in_R9D == 0)) {
    local_4c = *(undefined4 *)(in_RSI + 0x41974);
  }
  local_50 = in_EDX;
  if ((in_R8D == 0) && (in_R9D == 1)) {
    local_50 = *(undefined4 *)(in_RSI + 0x41970);
  }
  if (in_R8D == 0) {
    *(undefined4 *)(in_RSI + 0x41970) = local_50;
    *(undefined4 *)(in_RSI + 0x41974) = local_4c;
  }
  else if (in_R8D == 1) {
    *(undefined4 *)(in_RSI + 0x41978) = local_50;
  }
  else if (in_R8D == 2) {
    *(undefined4 *)(in_RSI + 0x4197c) = local_50;
  }
  is_inter_tx_size_search_level_one((TX_SPEED_FEATURES *)(in_RSI + 0x60bc4));
  dst_bc = *(YV12_BUFFER_CONFIG **)&cm_00->width;
  a = (YV12_BUFFER_CONFIG *)(cm_00->ref_frame_map + 6);
  av1_loop_filter_frame_mt
            ((YV12_BUFFER_CONFIG *)CONCAT44(in_R8D,in_R9D),cm_00,
             (MACROBLOCKD *)CONCAT44(uVar3,in_stack_ffffffffffffffc8),(int)((ulong)lVar1 >> 0x20),
             (int)lVar1,partial_frame_00,in_RDI,unaff_EBX,unaff_retaddr,in_stack_00000008);
  iVar2 = aom_get_sse_plane(a,(YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff94,uVar3),
                            (int)((ulong)dst_bc >> 0x20),(int)dst_bc);
  yv12_copy_plane((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff94,uVar3),dst_bc,0);
  return iVar2;
}

Assistant:

static int64_t try_filter_frame(const YV12_BUFFER_CONFIG *sd,
                                AV1_COMP *const cpi, int filt_level,
                                int partial_frame, int plane, int dir) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  int num_workers = mt_info->num_mod_workers[MOD_LPF];
  AV1_COMMON *const cm = &cpi->common;
  int64_t filt_err;

  assert(plane >= 0 && plane <= 2);
  int filter_level[2] = { filt_level, filt_level };
  if (plane == 0 && dir == 0) filter_level[1] = cm->lf.filter_level[1];
  if (plane == 0 && dir == 1) filter_level[0] = cm->lf.filter_level[0];

  // set base filters for use of get_filter_level (av1_loopfilter.c) when in
  // DELTA_LF mode
  switch (plane) {
    case 0:
      cm->lf.filter_level[0] = filter_level[0];
      cm->lf.filter_level[1] = filter_level[1];
      break;
    case 1: cm->lf.filter_level_u = filter_level[0]; break;
    case 2: cm->lf.filter_level_v = filter_level[0]; break;
  }

  // lpf_opt_level = 1 : Enables dual/quad loop-filtering.
  int lpf_opt_level = is_inter_tx_size_search_level_one(&cpi->sf.tx_sf);

  av1_loop_filter_frame_mt(&cm->cur_frame->buf, cm, &cpi->td.mb.e_mbd, plane,
                           plane + 1, partial_frame, mt_info->workers,
                           num_workers, &mt_info->lf_row_sync, lpf_opt_level);

  filt_err = aom_get_sse_plane(sd, &cm->cur_frame->buf, plane,
                               cm->seq_params->use_highbitdepth);

  // Re-instate the unfiltered frame
  yv12_copy_plane(&cpi->last_frame_uf, &cm->cur_frame->buf, plane);

  return filt_err;
}